

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

void __thiscall
cppjieba::DictTrie::CreateTrie
          (DictTrie *this,vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *dictUnits
          )

{
  Trie *this_00;
  TrieNode *pTVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  pointer pDVar4;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> valuePointers;
  vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
  words;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> local_78;
  DictTrie *local_58;
  DictUnit *local_50;
  vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
  local_48;
  
  pDVar4 = (dictUnits->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_58 = this;
  if ((dictUnits->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
      _M_impl.super__Vector_impl_data._M_finish != pDVar4) {
    local_48.
    super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar3 = 0;
    local_48.
    super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (DictUnit **)0x0;
    local_78.
    super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (DictUnit **)0x0;
    uVar2 = 0;
    do {
      std::
      vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
      ::push_back(&local_48,(value_type *)((long)(pDVar4->word).buffer_ + lVar3));
      local_50 = (DictUnit *)
                 ((long)(((dictUnits->
                          super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>
                          )._M_impl.super__Vector_impl_data._M_start)->word).buffer_ + lVar3);
      if (local_78.
          super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_78.
          super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cppjieba::DictUnit_const*,std::allocator<cppjieba::DictUnit_const*>>::
        _M_realloc_insert<cppjieba::DictUnit_const*>
                  ((vector<cppjieba::DictUnit_const*,std::allocator<cppjieba::DictUnit_const*>> *)
                   &local_78,
                   (iterator)
                   local_78.
                   super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_50);
      }
      else {
        *local_78.
         super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_50;
        local_78.
        super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar2 = uVar2 + 1;
      pDVar4 = (dictUnits->
               super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x80;
    } while (uVar2 < (ulong)((long)(dictUnits->
                                   super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 7))
    ;
    this_00 = (Trie *)operator_new(8);
    pTVar1 = (TrieNode *)operator_new(0x10);
    pTVar1->next = (NextMap *)0x0;
    pTVar1->ptValue = (DictUnit *)0x0;
    this_00->root_ = pTVar1;
    Trie::CreateTrie(this_00,&local_48,&local_78);
    local_58->trie_ = this_00;
    if (local_78.
        super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>::
    ~vector(&local_48);
    return;
  }
  __assert_fail("dictUnits.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
                ,0xae,"void cppjieba::DictTrie::CreateTrie(const vector<DictUnit> &)");
}

Assistant:

void CreateTrie(const vector<DictUnit>& dictUnits) {
    assert(dictUnits.size());
    vector<Unicode> words;
    vector<const DictUnit*> valuePointers;
    for (size_t i = 0 ; i < dictUnits.size(); i ++) {
      words.push_back(dictUnits[i].word);
      valuePointers.push_back(&dictUnits[i]);
    }

    trie_ = new Trie(words, valuePointers);
  }